

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshrand.c
# Opt level: O2

void random_save_seed(void)

{
  int len;
  void *data;
  int local_1c;
  void *local_18;
  
  if (random_active != 0) {
    random_get_savedata(&local_18,&local_1c);
    write_random_seed(local_18,local_1c);
    safefree(local_18);
    return;
  }
  return;
}

Assistant:

void random_save_seed(void)
{
    int len;
    void *data;

    if (random_active) {
        random_get_savedata(&data, &len);
        write_random_seed(data, len);
        sfree(data);
    }
}